

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

Vec_Flt_t * Scl_LibertyReadFloatVec(char *pName)

{
  Vec_Flt_t *pVVar1;
  float *__ptr;
  char *__nptr;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t __size;
  double dVar5;
  
  pVVar1 = (Vec_Flt_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  __ptr = (float *)malloc(400);
  pVVar1->pArray = __ptr;
  __nptr = strtok(pName," \t\n\r\\\",");
  if (__nptr != (char *)0x0) {
    iVar3 = 100;
    __size = 0;
    iVar2 = 0;
    uVar4 = 0;
    do {
      dVar5 = atof(__nptr);
      if ((int)uVar4 == iVar3) {
        if (uVar4 < 0x10) {
          if (__ptr == (float *)0x0) {
            __ptr = (float *)malloc(0x40);
          }
          else {
            __ptr = (float *)realloc(__ptr,0x40);
          }
          pVVar1->pArray = __ptr;
          iVar3 = 0x10;
        }
        else {
          if (__ptr == (float *)0x0) {
            __ptr = (float *)malloc(__size);
          }
          else {
            __ptr = (float *)realloc(__ptr,__size);
          }
          pVVar1->pArray = __ptr;
          iVar3 = iVar2;
        }
      }
      __ptr[uVar4] = (float)dVar5;
      uVar4 = uVar4 + 1;
      __nptr = strtok((char *)0x0," \t\n\r\\\",");
      iVar2 = iVar2 + 2;
      __size = __size + 8;
    } while (__nptr != (char *)0x0);
    pVVar1->nSize = (int)uVar4;
    pVVar1->nCap = iVar3;
  }
  return pVVar1;
}

Assistant:

Vec_Flt_t * Scl_LibertyReadFloatVec( char * pName )
{
    char * pToken;
    Vec_Flt_t * vValues = Vec_FltAlloc( 100 );
    for ( pToken = strtok(pName, " \t\n\r\\\","); pToken; pToken = strtok(NULL, " \t\n\r\\\",") )
        Vec_FltPush( vValues, atof(pToken) );
    return vValues;
}